

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O0

bool __thiscall BinarySearchTree::insert(BinarySearchTree *this,Node *node,Node *newNode)

{
  Node *pNVar1;
  Node *newNode_local;
  Node *node_local;
  BinarySearchTree *this_local;
  
  if (this->root == (Node *)0x0) {
    pNVar1 = (Node *)operator_new(0x18);
    this->root = pNVar1;
    this->root->value = newNode->value;
    this->root->leftChild = (Node *)0x0;
    this->root->rightChild = (Node *)0x0;
    this_local._7_1_ = true;
  }
  else if (node->value == newNode->value) {
    this_local._7_1_ = false;
  }
  else {
    if (newNode->value < node->value) {
      if (node->leftChild == (Node *)0x0) {
        node->leftChild = newNode;
        node->leftChild->leftChild = (Node *)0x0;
        node->leftChild->rightChild = (Node *)0x0;
        return true;
      }
      insert(this,node->leftChild,newNode);
    }
    else {
      if (node->rightChild == (Node *)0x0) {
        node->rightChild = newNode;
        node->rightChild->leftChild = (Node *)0x0;
        node->rightChild->rightChild = (Node *)0x0;
        return true;
      }
      insert(this,node->rightChild,newNode);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool BinarySearchTree::insert(Node *node, Node *newNode) {
    if (root == nullptr) {
        root = new Node;
        root->value = newNode->value;
        root->leftChild = nullptr;
        root->rightChild = nullptr;
        //  std::cout << "Root Node is Added" << std::endl;
        return true;
    }
    if (node->value == newNode->value) {
        //  std::cout << "Element already in the tree" << std::endl;
        return false;
    }
    if (node->value > newNode->value) {
        if (node->leftChild != nullptr) {
            insert(node->leftChild, newNode);
        } else {
            node->leftChild = newNode;
            (node->leftChild)->leftChild = nullptr;
            (node->leftChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Left" << std::endl;
            return true;
        }
    } else {
        if (node->rightChild != nullptr) {
            insert(node->rightChild, newNode);
        } else {
            node->rightChild = newNode;
            (node->rightChild)->leftChild = nullptr;
            (node->rightChild)->rightChild = nullptr;
            //  std::cout << "Node Added To Right" << std::endl;
            return true;
        }
    }
    return false;
}